

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::setUserInfo(XMLUri *this,XMLCh *newUserInfo)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  MalformedURLException *this_00;
  size_t __n;
  XMLCh *__dest;
  
  if ((newUserInfo != (XMLCh *)0x0) && (this->fHost == (XMLCh *)0x0)) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x48b,XMLNUM_URI_NullHost,(XMLCh *)errMsg_USERINFO,newUserInfo,(XMLCh *)0x0,
               (XMLCh *)0x0,this->fMemoryManager);
    __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
  }
  isConformantUserInfo(newUserInfo,this->fMemoryManager);
  if (this->fUserInfo != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  if ((newUserInfo == (XMLCh *)0x0) || (*newUserInfo == L'\0')) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)newUserInfo + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,newUserInfo,__n);
  }
  this->fUserInfo = __dest;
  return;
}

Assistant:

void XMLUri::setUserInfo(const XMLCh* const newUserInfo)
{
    if ( newUserInfo &&
         !getHost()    )
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_NullHost
                , errMsg_USERINFO
                , newUserInfo
                , fMemoryManager);
    }

    isConformantUserInfo(newUserInfo, fMemoryManager);

    if (getUserInfo())
    {
        fMemoryManager->deallocate(fUserInfo);//delete [] fUserInfo;
    }

    //sometimes we get passed a empty string rather than a null.
    //Other procedures rely on it being null
    if(newUserInfo && *newUserInfo) {
        fUserInfo = XMLString::replicate(newUserInfo, fMemoryManager);
    }
    else
        fUserInfo = 0;

}